

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<8,_1,_true,_embree::avx512::SubGridIntersector1Pluecker<8,_true>_>::intersect
               (Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float fVar1;
  float *pfVar7;
  undefined4 uVar8;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ushort uVar14;
  ushort uVar15;
  uint uVar16;
  Geometry *pGVar17;
  long lVar18;
  RTCFilterFunctionN p_Var19;
  RTCRayQueryContext *pRVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  float fVar27;
  ulong uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  byte bVar47;
  long lVar48;
  byte bVar49;
  uint uVar50;
  long lVar51;
  byte bVar52;
  uint uVar53;
  ulong uVar54;
  uint uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  long lVar60;
  ulong uVar61;
  ulong uVar62;
  long lVar63;
  bool bVar64;
  float fVar65;
  float fVar100;
  float fVar101;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar102;
  undefined1 auVar71 [16];
  float fVar103;
  float fVar104;
  float fVar105;
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  float fVar112;
  float fVar113;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined8 uVar119;
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [32];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [64];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  undefined1 auVar133 [32];
  undefined1 auVar134 [64];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  undefined1 auVar142 [64];
  undefined1 in_XMM27 [16];
  UVIdentity<8> mapUV;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<8> dist;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  long lStack_27c8;
  ulong *local_27c0;
  undefined1 local_27b1;
  RTCIntersectArguments *local_27b0;
  RayHit *local_27a8;
  RayQueryContext *local_27a0;
  ulong local_2798;
  int local_278c;
  ulong local_2788;
  ulong local_2780;
  ulong local_2778;
  ulong local_2770;
  ulong local_2768;
  ulong local_2760;
  ulong local_2758;
  long local_2750;
  long local_2748;
  ulong local_2740;
  ulong local_2738;
  ulong local_2730;
  ulong local_2728;
  ulong local_2720;
  ulong local_2718;
  long local_2710;
  ulong local_2708;
  RTCFilterFunctionNArguments local_2700;
  float local_26d0;
  float local_26cc;
  float local_26c8;
  undefined4 local_26c4;
  undefined4 local_26c0;
  undefined4 local_26bc;
  undefined4 local_26b8;
  uint local_26b4;
  uint local_26b0;
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 *local_25e0;
  byte local_25d8;
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  float local_2560 [4];
  float fStack_2550;
  float fStack_254c;
  float fStack_2548;
  uint uStack_2544;
  float local_2540 [4];
  float fStack_2530;
  float fStack_252c;
  float fStack_2528;
  uint uStack_2524;
  float local_2520 [4];
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  uint uStack_2504;
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  float local_2440;
  float fStack_243c;
  float fStack_2438;
  float fStack_2434;
  float fStack_2430;
  float fStack_242c;
  float fStack_2428;
  float fStack_2424;
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  ulong local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar68 [16];
  undefined1 auVar76 [32];
  
  local_23a0 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    local_27c0 = local_2390;
    local_2398[0] = 0;
    aVar9 = (ray->super_RayK<1>).dir.field_0;
    auVar71 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar26 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar66._8_4_ = 0x7fffffff;
    auVar66._0_8_ = 0x7fffffff7fffffff;
    auVar66._12_4_ = 0x7fffffff;
    auVar66 = vandps_avx512vl((undefined1  [16])aVar9,auVar66);
    auVar67._8_4_ = 0x219392ef;
    auVar67._0_8_ = 0x219392ef219392ef;
    auVar67._12_4_ = 0x219392ef;
    uVar54 = vcmpps_avx512vl(auVar66,auVar67,1);
    auVar115._8_4_ = 0x3f800000;
    auVar115._0_8_ = 0x3f8000003f800000;
    auVar115._12_4_ = 0x3f800000;
    auVar66 = vdivps_avx(auVar115,(undefined1  [16])aVar9);
    auVar67 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
    bVar64 = (bool)((byte)uVar54 & 1);
    auVar68._0_4_ = (uint)bVar64 * auVar67._0_4_ | (uint)!bVar64 * auVar66._0_4_;
    bVar64 = (bool)((byte)(uVar54 >> 1) & 1);
    auVar68._4_4_ = (uint)bVar64 * auVar67._4_4_ | (uint)!bVar64 * auVar66._4_4_;
    bVar64 = (bool)((byte)(uVar54 >> 2) & 1);
    auVar68._8_4_ = (uint)bVar64 * auVar67._8_4_ | (uint)!bVar64 * auVar66._8_4_;
    bVar64 = (bool)((byte)(uVar54 >> 3) & 1);
    auVar68._12_4_ = (uint)bVar64 * auVar67._12_4_ | (uint)!bVar64 * auVar66._12_4_;
    auVar69._8_4_ = 0x3f7ffffa;
    auVar69._0_8_ = 0x3f7ffffa3f7ffffa;
    auVar69._12_4_ = 0x3f7ffffa;
    auVar69 = vmulps_avx512vl(auVar68,auVar69);
    auVar70._8_4_ = 0x3f800003;
    auVar70._0_8_ = 0x3f8000033f800003;
    auVar70._12_4_ = 0x3f800003;
    auVar70 = vmulps_avx512vl(auVar68,auVar70);
    uVar8 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_24c0._4_4_ = uVar8;
    local_24c0._0_4_ = uVar8;
    local_24c0._8_4_ = uVar8;
    local_24c0._12_4_ = uVar8;
    local_24c0._16_4_ = uVar8;
    local_24c0._20_4_ = uVar8;
    local_24c0._24_4_ = uVar8;
    local_24c0._28_4_ = uVar8;
    uVar8 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_2400._4_4_ = uVar8;
    local_2400._0_4_ = uVar8;
    local_2400._8_4_ = uVar8;
    local_2400._12_4_ = uVar8;
    local_2400._16_4_ = uVar8;
    local_2400._20_4_ = uVar8;
    local_2400._24_4_ = uVar8;
    local_2400._28_4_ = uVar8;
    auVar131 = ZEXT3264(local_2400);
    uVar8 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_2420._4_4_ = uVar8;
    local_2420._0_4_ = uVar8;
    local_2420._8_4_ = uVar8;
    local_2420._12_4_ = uVar8;
    local_2420._16_4_ = uVar8;
    local_2420._20_4_ = uVar8;
    local_2420._24_4_ = uVar8;
    local_2420._28_4_ = uVar8;
    auVar132 = ZEXT3264(local_2420);
    fVar112 = auVar69._0_4_;
    local_24e0._4_4_ = fVar112;
    local_24e0._0_4_ = fVar112;
    local_24e0._8_4_ = fVar112;
    local_24e0._12_4_ = fVar112;
    local_24e0._16_4_ = fVar112;
    local_24e0._20_4_ = fVar112;
    local_24e0._24_4_ = fVar112;
    local_24e0._28_4_ = fVar112;
    auVar66 = vmovshdup_avx(auVar69);
    uVar119 = auVar66._0_8_;
    local_2500._8_8_ = uVar119;
    local_2500._0_8_ = uVar119;
    local_2500._16_8_ = uVar119;
    local_2500._24_8_ = uVar119;
    auVar67 = vshufpd_avx(auVar69,auVar69,1);
    auVar72._8_4_ = 2;
    auVar72._0_8_ = 0x200000002;
    auVar72._12_4_ = 2;
    auVar72._16_4_ = 2;
    auVar72._20_4_ = 2;
    auVar72._24_4_ = 2;
    auVar72._28_4_ = 2;
    local_2680 = vpermps_avx2(auVar72,ZEXT1632(auVar69));
    fVar104 = auVar70._0_4_;
    auVar78._8_4_ = 1;
    auVar78._0_8_ = 0x100000001;
    auVar78._12_4_ = 1;
    auVar78._16_4_ = 1;
    auVar78._20_4_ = 1;
    auVar78._24_4_ = 1;
    auVar78._28_4_ = 1;
    local_2460 = vpermps_avx2(auVar78,ZEXT1632(auVar70));
    auVar139 = ZEXT3264(local_2460);
    local_2480 = vpermps_avx512vl(auVar72,ZEXT1632(auVar70));
    auVar140 = ZEXT3264(local_2480);
    auVar123 = ZEXT3264(local_24c0);
    auVar124 = ZEXT3264(local_24e0);
    uVar54 = (ulong)(fVar112 < 0.0) << 5;
    auVar120 = ZEXT3264(local_2680);
    uVar56 = (ulong)(auVar66._0_4_ < 0.0) << 5 | 0x40;
    auVar121 = ZEXT3264(local_2500);
    uVar57 = (ulong)(auVar67._0_4_ < 0.0) << 5 | 0x80;
    uVar58 = uVar54 ^ 0x20;
    uVar59 = uVar56 ^ 0x20;
    uVar62 = uVar57 ^ 0x20;
    local_24a0 = vbroadcastss_avx512vl(auVar71);
    auVar141 = ZEXT3264(local_24a0);
    auVar72 = vbroadcastss_avx512vl(auVar26);
    auVar142 = ZEXT3264(auVar72);
    local_2758 = (ulong)(((uint)(fVar112 < 0.0) << 5) >> 2);
    local_2760 = uVar58 >> 2;
    local_2768 = uVar56 >> 2;
    local_2770 = uVar59 >> 2;
    local_2778 = uVar57 >> 2;
    local_2780 = uVar62 >> 2;
    auVar72 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
    auVar134 = ZEXT3264(auVar72);
    auVar128 = ZEXT3264(CONCAT428(0xfffffff8,
                                  CONCAT424(0xfffffff8,
                                            CONCAT420(0xfffffff8,
                                                      CONCAT416(0xfffffff8,
                                                                CONCAT412(0xfffffff8,
                                                                          CONCAT48(0xfffffff8,
                                                                                                                                                                      
                                                  0xfffffff8fffffff8)))))));
    local_2718 = uVar54;
    local_2440 = fVar104;
    fStack_243c = fVar104;
    fStack_2438 = fVar104;
    fStack_2434 = fVar104;
    fStack_2430 = fVar104;
    fStack_242c = fVar104;
    fStack_2428 = fVar104;
    fStack_2424 = fVar104;
    local_2720 = uVar56;
    local_2728 = uVar57;
    local_2730 = uVar58;
    local_2738 = uVar59;
    local_2740 = uVar62;
    fVar112 = fVar104;
    fVar65 = fVar104;
    fVar100 = fVar104;
    fVar101 = fVar104;
    fVar102 = fVar104;
    fVar103 = fVar104;
    local_27a8 = ray;
    local_27a0 = context;
LAB_01c857cb:
    if (local_27c0 != &local_23a0) {
      pfVar7 = (float *)(local_27c0 + -1);
      local_27c0 = local_27c0 + -2;
      if (*pfVar7 <= (ray->super_RayK<1>).tfar) {
        uVar61 = *local_27c0;
LAB_01c857f3:
        do {
          if ((uVar61 & 8) != 0) goto LAB_01c85bd5;
          auVar77 = auVar123._0_32_;
          auVar72 = vsubps_avx(*(undefined1 (*) [32])(uVar61 + 0x40 + uVar54),auVar77);
          auVar36._4_4_ = auVar124._4_4_ * auVar72._4_4_;
          auVar36._0_4_ = auVar124._0_4_ * auVar72._0_4_;
          auVar36._8_4_ = auVar124._8_4_ * auVar72._8_4_;
          auVar36._12_4_ = auVar124._12_4_ * auVar72._12_4_;
          auVar36._16_4_ = auVar124._16_4_ * auVar72._16_4_;
          auVar36._20_4_ = auVar124._20_4_ * auVar72._20_4_;
          auVar36._24_4_ = auVar124._24_4_ * auVar72._24_4_;
          auVar36._28_4_ = auVar72._28_4_;
          auVar72 = vsubps_avx(*(undefined1 (*) [32])(uVar61 + 0x40 + uVar56),auVar131._0_32_);
          auVar37._4_4_ = auVar121._4_4_ * auVar72._4_4_;
          auVar37._0_4_ = auVar121._0_4_ * auVar72._0_4_;
          auVar37._8_4_ = auVar121._8_4_ * auVar72._8_4_;
          auVar37._12_4_ = auVar121._12_4_ * auVar72._12_4_;
          auVar37._16_4_ = auVar121._16_4_ * auVar72._16_4_;
          auVar37._20_4_ = auVar121._20_4_ * auVar72._20_4_;
          auVar37._24_4_ = auVar121._24_4_ * auVar72._24_4_;
          auVar37._28_4_ = auVar72._28_4_;
          auVar72 = vmaxps_avx(auVar36,auVar37);
          auVar78 = vsubps_avx(*(undefined1 (*) [32])(uVar61 + 0x40 + uVar57),auVar132._0_32_);
          auVar38._4_4_ = auVar120._4_4_ * auVar78._4_4_;
          auVar38._0_4_ = auVar120._0_4_ * auVar78._0_4_;
          auVar38._8_4_ = auVar120._8_4_ * auVar78._8_4_;
          auVar38._12_4_ = auVar120._12_4_ * auVar78._12_4_;
          auVar38._16_4_ = auVar120._16_4_ * auVar78._16_4_;
          auVar38._20_4_ = auVar120._20_4_ * auVar78._20_4_;
          auVar38._24_4_ = auVar120._24_4_ * auVar78._24_4_;
          auVar38._28_4_ = auVar78._28_4_;
          auVar78 = vsubps_avx(*(undefined1 (*) [32])(uVar61 + 0x40 + uVar58),auVar77);
          auVar39._4_4_ = fVar112 * auVar78._4_4_;
          auVar39._0_4_ = fVar104 * auVar78._0_4_;
          auVar39._8_4_ = fVar65 * auVar78._8_4_;
          auVar39._12_4_ = fVar100 * auVar78._12_4_;
          auVar39._16_4_ = fVar101 * auVar78._16_4_;
          auVar39._20_4_ = fVar102 * auVar78._20_4_;
          auVar39._24_4_ = fVar103 * auVar78._24_4_;
          auVar39._28_4_ = auVar78._28_4_;
          auVar78 = vsubps_avx(*(undefined1 (*) [32])(uVar61 + 0x40 + uVar59),auVar131._0_32_);
          auVar40._4_4_ = auVar139._4_4_ * auVar78._4_4_;
          auVar40._0_4_ = auVar139._0_4_ * auVar78._0_4_;
          auVar40._8_4_ = auVar139._8_4_ * auVar78._8_4_;
          auVar40._12_4_ = auVar139._12_4_ * auVar78._12_4_;
          auVar40._16_4_ = auVar139._16_4_ * auVar78._16_4_;
          auVar40._20_4_ = auVar139._20_4_ * auVar78._20_4_;
          auVar40._24_4_ = auVar139._24_4_ * auVar78._24_4_;
          auVar40._28_4_ = auVar78._28_4_;
          auVar78 = vminps_avx(auVar39,auVar40);
          auVar73 = vsubps_avx(*(undefined1 (*) [32])(uVar61 + 0x40 + uVar62),auVar132._0_32_);
          auVar73 = vmulps_avx512vl(auVar140._0_32_,auVar73);
          auVar74 = vmaxps_avx512vl(auVar38,auVar141._0_32_);
          auVar72 = vmaxps_avx(auVar72,auVar74);
          auVar73 = vminps_avx512vl(auVar73,auVar142._0_32_);
          auVar78 = vminps_avx(auVar78,auVar73);
          uVar28 = vcmpps_avx512vl(auVar72,auVar78,2);
          bVar52 = (byte)uVar28;
          if (bVar52 == 0) break;
          auVar78 = *(undefined1 (*) [32])(uVar61 & 0xfffffffffffffff0);
          auVar73 = ((undefined1 (*) [32])(uVar61 & 0xfffffffffffffff0))[1];
          auVar74 = vpternlogd_avx512vl(auVar134._0_32_,auVar72,auVar128._0_32_,0xf8);
          auVar75 = vpcompressd_avx512vl(auVar74);
          auVar76._0_4_ =
               (uint)(bVar52 & 1) * auVar75._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar74._0_4_;
          bVar64 = (bool)((byte)(uVar28 >> 1) & 1);
          auVar76._4_4_ = (uint)bVar64 * auVar75._4_4_ | (uint)!bVar64 * auVar74._4_4_;
          bVar64 = (bool)((byte)(uVar28 >> 2) & 1);
          auVar76._8_4_ = (uint)bVar64 * auVar75._8_4_ | (uint)!bVar64 * auVar74._8_4_;
          bVar64 = (bool)((byte)(uVar28 >> 3) & 1);
          auVar76._12_4_ = (uint)bVar64 * auVar75._12_4_ | (uint)!bVar64 * auVar74._12_4_;
          bVar64 = (bool)((byte)(uVar28 >> 4) & 1);
          auVar76._16_4_ = (uint)bVar64 * auVar75._16_4_ | (uint)!bVar64 * auVar74._16_4_;
          bVar64 = (bool)((byte)(uVar28 >> 5) & 1);
          auVar76._20_4_ = (uint)bVar64 * auVar75._20_4_ | (uint)!bVar64 * auVar74._20_4_;
          bVar64 = (bool)((byte)(uVar28 >> 6) & 1);
          auVar76._24_4_ = (uint)bVar64 * auVar75._24_4_ | (uint)!bVar64 * auVar74._24_4_;
          bVar64 = SUB81(uVar28 >> 7,0);
          auVar76._28_4_ = (uint)bVar64 * auVar75._28_4_ | (uint)!bVar64 * auVar74._28_4_;
          auVar74 = vpermt2q_avx512vl(auVar78,auVar76,auVar73);
          uVar61 = auVar74._0_8_;
          bVar52 = bVar52 - 1 & bVar52;
          if (bVar52 != 0) {
            auVar74 = vpshufd_avx2(auVar76,0x55);
            vpermt2q_avx512vl(auVar78,auVar74,auVar73);
            auVar75 = vpminsd_avx2(auVar76,auVar74);
            auVar74 = vpmaxsd_avx2(auVar76,auVar74);
            bVar52 = bVar52 - 1 & bVar52;
            if (bVar52 == 0) {
              auVar77 = vpermi2q_avx512vl(auVar75,auVar78,auVar73);
              uVar61 = auVar77._0_8_;
              auVar78 = vpermt2q_avx512vl(auVar78,auVar74,auVar73);
              *local_27c0 = auVar78._0_8_;
              lVar48 = 8;
              lStack_27c8 = 0x10;
            }
            else {
              auVar83 = vpshufd_avx2(auVar76,0xaa);
              vpermt2q_avx512vl(auVar78,auVar83,auVar73);
              auVar80 = vpminsd_avx2(auVar75,auVar83);
              auVar75 = vpmaxsd_avx2(auVar75,auVar83);
              auVar83 = vpminsd_avx2(auVar74,auVar75);
              auVar75 = vpmaxsd_avx2(auVar74,auVar75);
              bVar52 = bVar52 - 1 & bVar52;
              if (bVar52 == 0) {
                auVar74 = vpermi2q_avx512vl(auVar80,auVar78,auVar73);
                uVar61 = auVar74._0_8_;
                auVar74 = vpermt2q_avx512vl(auVar78,auVar75,auVar73);
                *local_27c0 = auVar74._0_8_;
                auVar74 = vpermd_avx2(auVar75,auVar72);
                *(int *)(local_27c0 + 1) = auVar74._0_4_;
                auVar78 = vpermt2q_avx512vl(auVar78,auVar83,auVar73);
                local_27c0[2] = auVar78._0_8_;
                lVar48 = 0x18;
                lStack_27c8 = 0x20;
                auVar74 = auVar83;
              }
              else {
                auVar79 = vmovdqa64_avx512vl(auVar134._0_32_);
                auVar74 = vpshufd_avx2(auVar76,0xff);
                vpermt2q_avx512vl(auVar78,auVar74,auVar73);
                auVar82 = vpminsd_avx2(auVar80,auVar74);
                auVar80 = vpmaxsd_avx2(auVar80,auVar74);
                auVar74 = vpminsd_avx2(auVar83,auVar80);
                auVar80 = vpmaxsd_avx2(auVar83,auVar80);
                auVar83 = vpminsd_avx2(auVar75,auVar80);
                auVar75 = vpmaxsd_avx2(auVar75,auVar80);
                bVar52 = bVar52 - 1 & bVar52;
                if (bVar52 != 0) {
                  auVar81 = valignd_avx512vl(auVar76,auVar76,3);
                  auVar80 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                  auVar82 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                 CONCAT48(0x80000000,
                                                                          0x8000000080000000))),
                                              auVar80,auVar82);
                  auVar80 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                  auVar74 = vpermt2d_avx512vl(auVar82,auVar80,auVar74);
                  auVar80 = vpermt2d_avx512vl(auVar74,auVar80,auVar83);
                  auVar74 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                  auVar74 = vpermt2d_avx512vl(auVar80,auVar74,auVar75);
                  auVar120 = ZEXT3264(auVar74);
                  bVar49 = bVar52;
                  do {
                    auVar75 = auVar120._0_32_;
                    auVar117._8_4_ = 1;
                    auVar117._0_8_ = 0x100000001;
                    auVar117._12_4_ = 1;
                    auVar117._16_4_ = 1;
                    auVar117._20_4_ = 1;
                    auVar117._24_4_ = 1;
                    auVar117._28_4_ = 1;
                    auVar74 = vpermd_avx2(auVar117,auVar81);
                    auVar81 = valignd_avx512vl(auVar81,auVar81,1);
                    vpermt2q_avx512vl(auVar78,auVar81,auVar73);
                    bVar49 = bVar49 - 1 & bVar49;
                    uVar119 = vpcmpd_avx512vl(auVar74,auVar75,5);
                    auVar74 = vpmaxsd_avx2(auVar74,auVar75);
                    bVar47 = (byte)uVar119 << 1;
                    auVar75 = valignd_avx512vl(auVar75,auVar75,7);
                    bVar64 = (bool)((byte)uVar119 & 1);
                    bVar21 = (bool)(bVar47 >> 2 & 1);
                    bVar22 = (bool)(bVar47 >> 3 & 1);
                    bVar23 = (bool)(bVar47 >> 4 & 1);
                    bVar24 = (bool)(bVar47 >> 5 & 1);
                    bVar25 = (bool)(bVar47 >> 6 & 1);
                    auVar120 = ZEXT3264(CONCAT428((uint)(bVar47 >> 7) * auVar75._28_4_ |
                                                  (uint)!(bool)(bVar47 >> 7) * auVar74._28_4_,
                                                  CONCAT424((uint)bVar25 * auVar75._24_4_ |
                                                            (uint)!bVar25 * auVar74._24_4_,
                                                            CONCAT420((uint)bVar24 * auVar75._20_4_
                                                                      | (uint)!bVar24 *
                                                                        auVar74._20_4_,
                                                                      CONCAT416((uint)bVar23 *
                                                                                auVar75._16_4_ |
                                                                                (uint)!bVar23 *
                                                                                auVar74._16_4_,
                                                                                CONCAT412((uint)
                                                  bVar22 * auVar75._12_4_ |
                                                  (uint)!bVar22 * auVar74._12_4_,
                                                  CONCAT48((uint)bVar21 * auVar75._8_4_ |
                                                           (uint)!bVar21 * auVar74._8_4_,
                                                           CONCAT44((uint)bVar64 * auVar75._4_4_ |
                                                                    (uint)!bVar64 * auVar74._4_4_,
                                                                    auVar74._0_4_))))))));
                  } while (bVar49 != 0);
                  lVar48 = (ulong)(uint)POPCOUNT((uint)bVar52) + 3;
                  while( true ) {
                    auVar75 = auVar120._0_32_;
                    auVar74 = vpermt2q_avx512vl(auVar78,auVar75,auVar73);
                    uVar61 = auVar74._0_8_;
                    bVar64 = lVar48 == 0;
                    lVar48 = lVar48 + -1;
                    if (bVar64) break;
                    *local_27c0 = uVar61;
                    auVar74 = vpermd_avx2(auVar75,auVar72);
                    *(int *)(local_27c0 + 1) = auVar74._0_4_;
                    auVar74 = valignd_avx512vl(auVar75,auVar75,1);
                    auVar120 = ZEXT3264(auVar74);
                    local_27c0 = local_27c0 + 2;
                  }
                  auVar123 = ZEXT3264(auVar77);
                  auVar124 = ZEXT3264(auVar124._0_32_);
                  auVar121 = ZEXT3264(auVar121._0_32_);
                  auVar120 = ZEXT3264(local_2680);
                  auVar72 = vmovdqa64_avx512vl(auVar79);
                  auVar134 = ZEXT3264(auVar72);
                  auVar128 = ZEXT3264(CONCAT428(0xfffffff8,
                                                CONCAT424(0xfffffff8,
                                                          CONCAT420(0xfffffff8,
                                                                    CONCAT416(0xfffffff8,
                                                                              CONCAT412(0xfffffff8,
                                                                                        CONCAT48(
                                                  0xfffffff8,0xfffffff8fffffff8)))))));
                  context = local_27a0;
                  ray = local_27a8;
                  goto LAB_01c857f3;
                }
                auVar80 = vpermi2q_avx512vl(auVar82,auVar78,auVar73);
                uVar61 = auVar80._0_8_;
                auVar80 = vpermt2q_avx512vl(auVar78,auVar75,auVar73);
                *local_27c0 = auVar80._0_8_;
                auVar75 = vpermd_avx2(auVar75,auVar72);
                *(int *)(local_27c0 + 1) = auVar75._0_4_;
                auVar75 = vpermt2q_avx512vl(auVar78,auVar83,auVar73);
                local_27c0[2] = auVar75._0_8_;
                auVar75 = vpermd_avx2(auVar83,auVar72);
                *(int *)(local_27c0 + 3) = auVar75._0_4_;
                auVar78 = vpermt2q_avx512vl(auVar78,auVar74,auVar73);
                local_27c0[4] = auVar78._0_8_;
                lStack_27c8 = 0x28;
                lVar48 = lStack_27c8;
                lStack_27c8 = 0x30;
                auVar124 = ZEXT3264(auVar124._0_32_);
                auVar78 = vmovdqa64_avx512vl(auVar79);
                auVar134 = ZEXT3264(auVar78);
              }
              auVar123 = ZEXT3264(auVar77);
              auVar121 = ZEXT3264(auVar121._0_32_);
              auVar128 = ZEXT3264(CONCAT428(0xfffffff8,
                                            CONCAT424(0xfffffff8,
                                                      CONCAT420(0xfffffff8,
                                                                CONCAT416(0xfffffff8,
                                                                          CONCAT412(0xfffffff8,
                                                                                    CONCAT48(
                                                  0xfffffff8,0xfffffff8fffffff8)))))));
            }
            auVar72 = vpermd_avx2(auVar74,auVar72);
            *(int *)((long)local_27c0 + lVar48) = auVar72._0_4_;
            local_27c0 = (ulong *)((long)local_27c0 + lStack_27c8);
            auVar120 = ZEXT3264(local_2680);
          }
        } while( true );
      }
      goto LAB_01c857cb;
    }
  }
  return;
LAB_01c85bd5:
  local_2750 = (ulong)((uint)uVar61 & 0xf) - 8;
  uVar61 = uVar61 & 0xfffffffffffffff0;
  local_23e0 = auVar142._0_32_;
  for (local_2748 = 0; local_2748 != local_2750; local_2748 = local_2748 + 1) {
    lVar48 = local_2748 * 0x90;
    local_2710 = lVar48 + uVar61;
    auVar106._8_8_ = 0;
    auVar106._0_8_ = *(ulong *)(uVar61 + 0x40 + lVar48);
    auVar110._8_8_ = 0;
    auVar110._0_8_ = *(ulong *)(uVar61 + 0x48 + lVar48);
    uVar30 = vpcmpub_avx512vl(auVar106,auVar110,2);
    uVar8 = *(undefined4 *)(uVar61 + 0x70 + lVar48);
    auVar83._4_4_ = uVar8;
    auVar83._0_4_ = uVar8;
    auVar83._8_4_ = uVar8;
    auVar83._12_4_ = uVar8;
    auVar83._16_4_ = uVar8;
    auVar83._20_4_ = uVar8;
    auVar83._24_4_ = uVar8;
    auVar83._28_4_ = uVar8;
    uVar8 = *(undefined4 *)(uVar61 + 0x7c + lVar48);
    auVar81._4_4_ = uVar8;
    auVar81._0_4_ = uVar8;
    auVar81._8_4_ = uVar8;
    auVar81._12_4_ = uVar8;
    auVar81._16_4_ = uVar8;
    auVar81._20_4_ = uVar8;
    auVar81._24_4_ = uVar8;
    auVar81._28_4_ = uVar8;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = *(ulong *)(local_2758 + 0x40 + local_2710);
    auVar72 = vpmovzxbd_avx2(auVar71);
    auVar72 = vcvtdq2ps_avx(auVar72);
    auVar66 = vfmadd213ps_fma(auVar72,auVar81,auVar83);
    auVar26._8_8_ = 0;
    auVar26._0_8_ = *(ulong *)(local_2760 + 0x40 + local_2710);
    auVar72 = vpmovzxbd_avx2(auVar26);
    auVar72 = vcvtdq2ps_avx(auVar72);
    auVar71 = vfmadd213ps_fma(auVar72,auVar81,auVar83);
    uVar8 = *(undefined4 *)(uVar61 + 0x74 + lVar48);
    auVar82._4_4_ = uVar8;
    auVar82._0_4_ = uVar8;
    auVar82._8_4_ = uVar8;
    auVar82._12_4_ = uVar8;
    auVar82._16_4_ = uVar8;
    auVar82._20_4_ = uVar8;
    auVar82._24_4_ = uVar8;
    auVar82._28_4_ = uVar8;
    uVar8 = *(undefined4 *)(uVar61 + 0x80 + lVar48);
    auVar84._4_4_ = uVar8;
    auVar84._0_4_ = uVar8;
    auVar84._8_4_ = uVar8;
    auVar84._12_4_ = uVar8;
    auVar84._16_4_ = uVar8;
    auVar84._20_4_ = uVar8;
    auVar84._24_4_ = uVar8;
    auVar84._28_4_ = uVar8;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = *(ulong *)(local_2768 + 0x40 + local_2710);
    auVar72 = vpmovzxbd_avx2(auVar10);
    auVar72 = vcvtdq2ps_avx(auVar72);
    auVar26 = vfmadd213ps_fma(auVar72,auVar84,auVar82);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = *(ulong *)(local_2770 + 0x40 + local_2710);
    auVar72 = vpmovzxbd_avx2(auVar11);
    auVar72 = vcvtdq2ps_avx(auVar72);
    auVar67 = vfmadd213ps_fma(auVar72,auVar84,auVar82);
    uVar8 = *(undefined4 *)(uVar61 + 0x78 + lVar48);
    auVar79._4_4_ = uVar8;
    auVar79._0_4_ = uVar8;
    auVar79._8_4_ = uVar8;
    auVar79._12_4_ = uVar8;
    auVar79._16_4_ = uVar8;
    auVar79._20_4_ = uVar8;
    auVar79._24_4_ = uVar8;
    auVar79._28_4_ = uVar8;
    uVar8 = *(undefined4 *)(uVar61 + 0x84 + lVar48);
    auVar85._4_4_ = uVar8;
    auVar85._0_4_ = uVar8;
    auVar85._8_4_ = uVar8;
    auVar85._12_4_ = uVar8;
    auVar85._16_4_ = uVar8;
    auVar85._20_4_ = uVar8;
    auVar85._24_4_ = uVar8;
    auVar85._28_4_ = uVar8;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = *(ulong *)(local_2778 + 0x40 + local_2710);
    auVar72 = vpmovzxbd_avx2(auVar12);
    auVar72 = vcvtdq2ps_avx(auVar72);
    auVar69 = vfmadd213ps_fma(auVar72,auVar85,auVar79);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = *(ulong *)(local_2780 + 0x40 + local_2710);
    auVar72 = vpmovzxbd_avx2(auVar13);
    auVar72 = vcvtdq2ps_avx(auVar72);
    auVar70 = vfmadd213ps_fma(auVar72,auVar85,auVar79);
    auVar72 = vsubps_avx(ZEXT1632(auVar66),auVar123._0_32_);
    auVar73._4_4_ = auVar124._4_4_ * auVar72._4_4_;
    auVar73._0_4_ = auVar124._0_4_ * auVar72._0_4_;
    auVar73._8_4_ = auVar124._8_4_ * auVar72._8_4_;
    auVar73._12_4_ = auVar124._12_4_ * auVar72._12_4_;
    auVar73._16_4_ = auVar124._16_4_ * auVar72._16_4_;
    auVar73._20_4_ = auVar124._20_4_ * auVar72._20_4_;
    auVar73._24_4_ = auVar124._24_4_ * auVar72._24_4_;
    auVar73._28_4_ = auVar72._28_4_;
    auVar72 = vsubps_avx(ZEXT1632(auVar26),auVar131._0_32_);
    auVar74._4_4_ = auVar121._4_4_ * auVar72._4_4_;
    auVar74._0_4_ = auVar121._0_4_ * auVar72._0_4_;
    auVar74._8_4_ = auVar121._8_4_ * auVar72._8_4_;
    auVar74._12_4_ = auVar121._12_4_ * auVar72._12_4_;
    auVar74._16_4_ = auVar121._16_4_ * auVar72._16_4_;
    auVar74._20_4_ = auVar121._20_4_ * auVar72._20_4_;
    auVar74._24_4_ = auVar121._24_4_ * auVar72._24_4_;
    auVar74._28_4_ = auVar72._28_4_;
    auVar72 = vmaxps_avx(auVar73,auVar74);
    auVar78 = vsubps_avx(ZEXT1632(auVar69),auVar132._0_32_);
    auVar77._4_4_ = auVar120._4_4_ * auVar78._4_4_;
    auVar77._0_4_ = auVar120._0_4_ * auVar78._0_4_;
    auVar77._8_4_ = auVar120._8_4_ * auVar78._8_4_;
    auVar77._12_4_ = auVar120._12_4_ * auVar78._12_4_;
    auVar77._16_4_ = auVar120._16_4_ * auVar78._16_4_;
    auVar77._20_4_ = auVar120._20_4_ * auVar78._20_4_;
    auVar77._24_4_ = auVar120._24_4_ * auVar78._24_4_;
    auVar77._28_4_ = auVar78._28_4_;
    auVar78 = vsubps_avx(ZEXT1632(auVar71),auVar123._0_32_);
    auVar75._4_4_ = fVar112 * auVar78._4_4_;
    auVar75._0_4_ = fVar104 * auVar78._0_4_;
    auVar75._8_4_ = fVar65 * auVar78._8_4_;
    auVar75._12_4_ = fVar100 * auVar78._12_4_;
    auVar75._16_4_ = fVar101 * auVar78._16_4_;
    auVar75._20_4_ = fVar102 * auVar78._20_4_;
    auVar75._24_4_ = fVar103 * auVar78._24_4_;
    auVar75._28_4_ = auVar78._28_4_;
    auVar78 = vsubps_avx(ZEXT1632(auVar67),auVar131._0_32_);
    auVar80._4_4_ = auVar139._4_4_ * auVar78._4_4_;
    auVar80._0_4_ = auVar139._0_4_ * auVar78._0_4_;
    auVar80._8_4_ = auVar139._8_4_ * auVar78._8_4_;
    auVar80._12_4_ = auVar139._12_4_ * auVar78._12_4_;
    auVar80._16_4_ = auVar139._16_4_ * auVar78._16_4_;
    auVar80._20_4_ = auVar139._20_4_ * auVar78._20_4_;
    auVar80._24_4_ = auVar139._24_4_ * auVar78._24_4_;
    auVar80._28_4_ = auVar78._28_4_;
    auVar78 = vminps_avx(auVar75,auVar80);
    auVar73 = vsubps_avx(ZEXT1632(auVar70),auVar132._0_32_);
    auVar73 = vmulps_avx512vl(auVar140._0_32_,auVar73);
    auVar74 = vmaxps_avx512vl(auVar77,auVar141._0_32_);
    local_23c0 = vmaxps_avx(auVar72,auVar74);
    auVar72 = vminps_avx512vl(auVar73,auVar142._0_32_);
    auVar72 = vminps_avx(auVar78,auVar72);
    uVar119 = vcmpps_avx512vl(local_23c0,auVar72,2);
    local_2708 = CONCAT44((int)(local_2770 >> 0x20),(uint)(byte)((byte)uVar30 & (byte)uVar119));
    while (local_2708 != 0) {
      lVar48 = 0;
      for (uVar28 = local_2708; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
        lVar48 = lVar48 + 1;
      }
      local_2708 = local_2708 - 1 & local_2708;
      fVar113 = (ray->super_RayK<1>).tfar;
      if (*(float *)(local_23c0 + lVar48 * 4) <= fVar113) {
        uVar14 = *(ushort *)(local_2710 + lVar48 * 8);
        uVar15 = *(ushort *)(local_2710 + 2 + lVar48 * 8);
        uVar16 = *(uint *)(local_2710 + 0x88);
        local_2798 = (ulong)uVar16;
        uVar50 = *(uint *)(local_2710 + 4 + lVar48 * 8);
        pGVar17 = (context->scene->geometries).items[local_2798].ptr;
        lVar48 = *(long *)&pGVar17->field_0x58;
        local_2788 = (ulong)uVar50;
        lVar51 = pGVar17[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                 (ulong)uVar50;
        uVar53 = uVar15 & 0x7fff;
        uVar55 = *(uint *)(lVar48 + 4 + lVar51);
        uVar56 = (ulong)uVar55;
        local_26a0._0_4_ = uVar53;
        uVar57 = (ulong)(uVar55 * uVar53 + *(int *)(lVar48 + lVar51) + (uVar14 & 0x7fff));
        lVar18 = *(long *)&pGVar17[1].time_range.upper;
        p_Var19 = pGVar17[1].intersectionFilterN;
        auVar66 = *(undefined1 (*) [16])(lVar18 + (uVar57 + 1) * (long)p_Var19);
        auVar71 = *(undefined1 (*) [16])(lVar18 + (uVar57 + uVar56) * (long)p_Var19);
        lVar63 = uVar57 + uVar56 + 1;
        auVar26 = *(undefined1 (*) [16])(lVar18 + lVar63 * (long)p_Var19);
        uVar54 = (ulong)(-1 < (short)uVar14);
        auVar67 = *(undefined1 (*) [16])(lVar18 + (uVar57 + uVar54 + 1) * (long)p_Var19);
        lVar60 = uVar54 + lVar63;
        auVar69 = *(undefined1 (*) [16])(lVar18 + lVar60 * (long)p_Var19);
        uVar54 = 0;
        if (-1 < (short)uVar15) {
          uVar54 = uVar56;
        }
        auVar70 = *(undefined1 (*) [16])(lVar18 + (uVar57 + uVar56 + uVar54) * (long)p_Var19);
        auVar68 = *(undefined1 (*) [16])(lVar18 + (lVar63 + uVar54) * (long)p_Var19);
        auVar125._16_16_ = *(undefined1 (*) [16])(lVar18 + (uVar54 + lVar60) * (long)p_Var19);
        auVar125._0_16_ = auVar26;
        auVar10 = vunpcklps_avx(auVar66,auVar69);
        auVar115 = vunpckhps_avx(auVar66,auVar69);
        auVar11 = vunpcklps_avx(auVar67,auVar26);
        auVar67 = vunpckhps_avx(auVar67,auVar26);
        auVar12 = vunpcklps_avx(auVar115,auVar67);
        auVar13 = vunpcklps_avx(auVar10,auVar11);
        auVar67 = vunpckhps_avx(auVar10,auVar11);
        auVar10 = vunpcklps_avx(auVar71,auVar68);
        auVar115 = vunpckhps_avx(auVar71,auVar68);
        auVar11 = vunpcklps_avx(auVar26,auVar70);
        auVar70 = vunpckhps_avx(auVar26,auVar70);
        auVar115 = vunpcklps_avx(auVar115,auVar70);
        auVar106 = vunpcklps_avx(auVar10,auVar11);
        auVar70 = vunpckhps_avx(auVar10,auVar11);
        auVar89._16_16_ = auVar68;
        auVar89._0_16_ = auVar71;
        auVar87._16_16_ = auVar69;
        auVar87._0_16_ = auVar66;
        auVar72 = vunpcklps_avx(auVar87,auVar89);
        auVar86._16_16_ = auVar26;
        auVar86._0_16_ = *(undefined1 (*) [16])(lVar18 + (long)p_Var19 * uVar57);
        auVar78 = vunpcklps_avx(auVar86,auVar125);
        auVar74 = vunpcklps_avx(auVar78,auVar72);
        auVar78 = vunpckhps_avx(auVar78,auVar72);
        auVar72 = vunpckhps_avx(auVar87,auVar89);
        auVar73 = vunpckhps_avx(auVar86,auVar125);
        auVar73 = vunpcklps_avx(auVar73,auVar72);
        auVar88._16_16_ = auVar13;
        auVar88._0_16_ = auVar13;
        auVar90._16_16_ = auVar67;
        auVar90._0_16_ = auVar67;
        auVar95._16_16_ = auVar12;
        auVar95._0_16_ = auVar12;
        auVar126._16_16_ = auVar106;
        auVar126._0_16_ = auVar106;
        auVar137._16_16_ = auVar70;
        auVar137._0_16_ = auVar70;
        uVar8 = *(undefined4 *)&(local_27a8->super_RayK<1>).org.field_0;
        auVar138._4_4_ = uVar8;
        auVar138._0_4_ = uVar8;
        auVar138._8_4_ = uVar8;
        auVar138._12_4_ = uVar8;
        auVar138._16_4_ = uVar8;
        auVar138._20_4_ = uVar8;
        auVar138._24_4_ = uVar8;
        auVar138._28_4_ = uVar8;
        auVar77 = vbroadcastss_avx512vl
                            (ZEXT416((uint)(local_27a8->super_RayK<1>).org.field_0.m128[1]));
        auVar75 = vbroadcastss_avx512vl
                            (ZEXT416((uint)(local_27a8->super_RayK<1>).org.field_0.m128[2]));
        uVar8 = *(undefined4 *)&(local_27a8->super_RayK<1>).dir.field_0;
        auVar122._4_4_ = uVar8;
        auVar122._0_4_ = uVar8;
        auVar122._8_4_ = uVar8;
        auVar122._12_4_ = uVar8;
        auVar122._16_4_ = uVar8;
        auVar122._20_4_ = uVar8;
        auVar122._24_4_ = uVar8;
        auVar122._28_4_ = uVar8;
        auVar135._16_16_ = auVar115;
        auVar135._0_16_ = auVar115;
        uVar8 = *(undefined4 *)((long)&(local_27a8->super_RayK<1>).dir.field_0 + 4);
        auVar129._4_4_ = uVar8;
        auVar129._0_4_ = uVar8;
        auVar129._8_4_ = uVar8;
        auVar129._12_4_ = uVar8;
        auVar129._16_4_ = uVar8;
        auVar129._20_4_ = uVar8;
        auVar129._24_4_ = uVar8;
        auVar129._28_4_ = uVar8;
        fVar112 = (local_27a8->super_RayK<1>).dir.field_0.m128[2];
        auVar133._4_4_ = fVar112;
        auVar133._0_4_ = fVar112;
        auVar133._8_4_ = fVar112;
        auVar133._12_4_ = fVar112;
        auVar133._16_4_ = fVar112;
        auVar133._20_4_ = fVar112;
        auVar133._24_4_ = fVar112;
        auVar133._28_4_ = fVar112;
        auVar72 = vsubps_avx(auVar74,auVar138);
        auVar74 = vsubps_avx512vl(auVar78,auVar77);
        auVar73 = vsubps_avx512vl(auVar73,auVar75);
        auVar78 = vsubps_avx(auVar88,auVar138);
        auVar80 = vsubps_avx512vl(auVar90,auVar77);
        auVar83 = vsubps_avx512vl(auVar95,auVar75);
        auVar82 = vsubps_avx512vl(auVar126,auVar138);
        auVar77 = vsubps_avx512vl(auVar137,auVar77);
        auVar75 = vsubps_avx512vl(auVar135,auVar75);
        auVar79 = vsubps_avx512vl(auVar82,auVar72);
        auVar81 = vsubps_avx512vl(auVar77,auVar74);
        auVar84 = vsubps_avx512vl(auVar75,auVar73);
        auVar85 = vsubps_avx512vl(auVar72,auVar78);
        auVar86 = vsubps_avx512vl(auVar74,auVar80);
        auVar87 = vsubps_avx512vl(auVar73,auVar83);
        auVar88 = vsubps_avx512vl(auVar78,auVar82);
        auVar89 = vsubps_avx512vl(auVar80,auVar77);
        auVar90 = vsubps_avx512vl(auVar83,auVar75);
        auVar91 = vaddps_avx512vl(auVar82,auVar72);
        auVar92 = vaddps_avx512vl(auVar77,auVar74);
        auVar93 = vaddps_avx512vl(auVar75,auVar73);
        auVar94 = vmulps_avx512vl(auVar92,auVar84);
        auVar94 = vfmsub231ps_avx512vl(auVar94,auVar81,auVar93);
        auVar93 = vmulps_avx512vl(auVar93,auVar79);
        auVar93 = vfmsub231ps_avx512vl(auVar93,auVar84,auVar91);
        auVar91 = vmulps_avx512vl(auVar91,auVar81);
        auVar66 = vfmsub231ps_fma(auVar91,auVar79,auVar92);
        auVar127._0_4_ = fVar112 * auVar66._0_4_;
        auVar127._4_4_ = fVar112 * auVar66._4_4_;
        auVar127._8_4_ = fVar112 * auVar66._8_4_;
        auVar127._12_4_ = fVar112 * auVar66._12_4_;
        auVar127._16_4_ = fVar112 * 0.0;
        auVar127._20_4_ = fVar112 * 0.0;
        auVar127._24_4_ = fVar112 * 0.0;
        auVar127._28_4_ = 0;
        auVar91 = vfmadd231ps_avx512vl(auVar127,auVar129,auVar93);
        auVar95 = vfmadd231ps_avx512vl(auVar91,auVar122,auVar94);
        auVar136._0_4_ = auVar72._0_4_ + auVar78._0_4_;
        auVar136._4_4_ = auVar72._4_4_ + auVar78._4_4_;
        auVar136._8_4_ = auVar72._8_4_ + auVar78._8_4_;
        auVar136._12_4_ = auVar72._12_4_ + auVar78._12_4_;
        auVar136._16_4_ = auVar72._16_4_ + auVar78._16_4_;
        auVar136._20_4_ = auVar72._20_4_ + auVar78._20_4_;
        auVar136._24_4_ = auVar72._24_4_ + auVar78._24_4_;
        auVar136._28_4_ = auVar72._28_4_ + auVar78._28_4_;
        auVar91 = vaddps_avx512vl(auVar74,auVar80);
        auVar92 = vaddps_avx512vl(auVar73,auVar83);
        auVar93 = vmulps_avx512vl(auVar91,auVar87);
        auVar93 = vfmsub231ps_avx512vl(auVar93,auVar86,auVar92);
        auVar92 = vmulps_avx512vl(auVar92,auVar85);
        auVar92 = vfmsub231ps_avx512vl(auVar92,auVar87,auVar136);
        auVar94 = vmulps_avx512vl(auVar136,auVar86);
        auVar91 = vfmsub231ps_avx512vl(auVar94,auVar85,auVar91);
        auVar94._4_4_ = fVar112 * auVar91._4_4_;
        auVar94._0_4_ = fVar112 * auVar91._0_4_;
        auVar94._8_4_ = fVar112 * auVar91._8_4_;
        auVar94._12_4_ = fVar112 * auVar91._12_4_;
        auVar94._16_4_ = fVar112 * auVar91._16_4_;
        auVar94._20_4_ = fVar112 * auVar91._20_4_;
        auVar94._24_4_ = fVar112 * auVar91._24_4_;
        auVar94._28_4_ = auVar91._28_4_;
        auVar91 = vfmadd231ps_avx512vl(auVar94,auVar129,auVar92);
        auVar94 = vfmadd231ps_avx512vl(auVar91,auVar122,auVar93);
        auVar78 = vaddps_avx512vl(auVar78,auVar82);
        auVar77 = vaddps_avx512vl(auVar80,auVar77);
        auVar75 = vaddps_avx512vl(auVar83,auVar75);
        auVar80 = vmulps_avx512vl(auVar77,auVar90);
        auVar80 = vfmsub231ps_avx512vl(auVar80,auVar89,auVar75);
        auVar41._4_4_ = auVar75._4_4_ * auVar88._4_4_;
        auVar41._0_4_ = auVar75._0_4_ * auVar88._0_4_;
        auVar41._8_4_ = auVar75._8_4_ * auVar88._8_4_;
        auVar41._12_4_ = auVar75._12_4_ * auVar88._12_4_;
        auVar41._16_4_ = auVar75._16_4_ * auVar88._16_4_;
        auVar41._20_4_ = auVar75._20_4_ * auVar88._20_4_;
        auVar41._24_4_ = auVar75._24_4_ * auVar88._24_4_;
        auVar41._28_4_ = auVar75._28_4_;
        auVar66 = vfmsub231ps_fma(auVar41,auVar90,auVar78);
        auVar42._4_4_ = auVar78._4_4_ * auVar89._4_4_;
        auVar42._0_4_ = auVar78._0_4_ * auVar89._0_4_;
        auVar42._8_4_ = auVar78._8_4_ * auVar89._8_4_;
        auVar42._12_4_ = auVar78._12_4_ * auVar89._12_4_;
        auVar42._16_4_ = auVar78._16_4_ * auVar89._16_4_;
        auVar42._20_4_ = auVar78._20_4_ * auVar89._20_4_;
        auVar42._24_4_ = auVar78._24_4_ * auVar89._24_4_;
        auVar42._28_4_ = auVar78._28_4_;
        auVar78 = vfmsub231ps_avx512vl(auVar42,auVar88,auVar77);
        auVar78 = vmulps_avx512vl(auVar133,auVar78);
        auVar78 = vfmadd231ps_avx512vl(auVar78,auVar129,ZEXT1632(auVar66));
        auVar78 = vfmadd231ps_avx512vl(auVar78,auVar122,auVar80);
        auVar111._0_4_ = auVar95._0_4_ + auVar94._0_4_;
        auVar111._4_4_ = auVar95._4_4_ + auVar94._4_4_;
        auVar111._8_4_ = auVar95._8_4_ + auVar94._8_4_;
        auVar111._12_4_ = auVar95._12_4_ + auVar94._12_4_;
        auVar111._16_4_ = auVar95._16_4_ + auVar94._16_4_;
        auVar111._20_4_ = auVar95._20_4_ + auVar94._20_4_;
        auVar111._24_4_ = auVar95._24_4_ + auVar94._24_4_;
        auVar111._28_4_ = auVar95._28_4_ + auVar94._28_4_;
        local_2600 = vaddps_avx512vl(auVar78,auVar111);
        auVar91._8_4_ = 0x7fffffff;
        auVar91._0_8_ = 0x7fffffff7fffffff;
        auVar91._12_4_ = 0x7fffffff;
        auVar91._16_4_ = 0x7fffffff;
        auVar91._20_4_ = 0x7fffffff;
        auVar91._24_4_ = 0x7fffffff;
        auVar91._28_4_ = 0x7fffffff;
        vandps_avx512vl(local_2600,auVar91);
        auVar92._8_4_ = 0x34000000;
        auVar92._0_8_ = 0x3400000034000000;
        auVar92._12_4_ = 0x34000000;
        auVar92._16_4_ = 0x34000000;
        auVar92._20_4_ = 0x34000000;
        auVar92._24_4_ = 0x34000000;
        auVar92._28_4_ = 0x34000000;
        auVar77 = vmulps_avx512vl(local_2600,auVar92);
        auVar75 = vminps_avx512vl(auVar95,auVar94);
        auVar75 = vminps_avx512vl(auVar75,auVar78);
        auVar93._8_4_ = 0x80000000;
        auVar93._0_8_ = 0x8000000080000000;
        auVar93._12_4_ = 0x80000000;
        auVar93._16_4_ = 0x80000000;
        auVar93._20_4_ = 0x80000000;
        auVar93._24_4_ = 0x80000000;
        auVar93._28_4_ = 0x80000000;
        auVar80 = vxorps_avx512vl(auVar77,auVar93);
        uVar119 = vcmpps_avx512vl(auVar75,auVar80,5);
        auVar75 = vmaxps_avx512vl(auVar95,auVar94);
        auVar78 = vmaxps_avx512vl(auVar75,auVar78);
        uVar30 = vcmpps_avx512vl(auVar78,auVar77,2);
        bVar52 = (byte)uVar119 | (byte)uVar30;
        ray = local_27a8;
        if (bVar52 != 0) {
          auVar78 = vmulps_avx512vl(auVar84,auVar86);
          auVar77 = vmulps_avx512vl(auVar79,auVar87);
          auVar75 = vmulps_avx512vl(auVar81,auVar85);
          auVar80 = vmulps_avx512vl(auVar87,auVar89);
          auVar83 = vmulps_avx512vl(auVar85,auVar90);
          auVar82 = vmulps_avx512vl(auVar86,auVar88);
          auVar81 = vfmsub213ps_avx512vl(auVar81,auVar87,auVar78);
          auVar84 = vfmsub213ps_avx512vl(auVar84,auVar85,auVar77);
          auVar79 = vfmsub213ps_avx512vl(auVar79,auVar86,auVar75);
          auVar91 = vfmsub213ps_avx512vl(auVar90,auVar86,auVar80);
          auVar92 = vfmsub213ps_avx512vl(auVar88,auVar87,auVar83);
          auVar85 = vfmsub213ps_avx512vl(auVar89,auVar85,auVar82);
          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar78,auVar93);
          vandps_avx512vl(auVar80,auVar93);
          uVar54 = vcmpps_avx512vl(auVar93,auVar93,1);
          vandps_avx512vl(auVar77,auVar93);
          vandps_avx512vl(auVar83,auVar93);
          uVar56 = vcmpps_avx512vl(auVar93,auVar93,1);
          vandps_avx512vl(auVar75,auVar93);
          vandps_avx512vl(auVar82,auVar93);
          uVar57 = vcmpps_avx512vl(auVar93,auVar93,1);
          bVar64 = (bool)((byte)uVar54 & 1);
          auVar96._0_4_ = (float)((uint)bVar64 * auVar81._0_4_ | (uint)!bVar64 * auVar91._0_4_);
          bVar64 = (bool)((byte)(uVar54 >> 1) & 1);
          auVar96._4_4_ = (float)((uint)bVar64 * auVar81._4_4_ | (uint)!bVar64 * auVar91._4_4_);
          bVar64 = (bool)((byte)(uVar54 >> 2) & 1);
          auVar96._8_4_ = (float)((uint)bVar64 * auVar81._8_4_ | (uint)!bVar64 * auVar91._8_4_);
          bVar64 = (bool)((byte)(uVar54 >> 3) & 1);
          auVar96._12_4_ = (float)((uint)bVar64 * auVar81._12_4_ | (uint)!bVar64 * auVar91._12_4_);
          bVar64 = (bool)((byte)(uVar54 >> 4) & 1);
          auVar96._16_4_ = (float)((uint)bVar64 * auVar81._16_4_ | (uint)!bVar64 * auVar91._16_4_);
          bVar64 = (bool)((byte)(uVar54 >> 5) & 1);
          auVar96._20_4_ = (float)((uint)bVar64 * auVar81._20_4_ | (uint)!bVar64 * auVar91._20_4_);
          bVar64 = (bool)((byte)(uVar54 >> 6) & 1);
          auVar96._24_4_ = (float)((uint)bVar64 * auVar81._24_4_ | (uint)!bVar64 * auVar91._24_4_);
          bVar64 = SUB81(uVar54 >> 7,0);
          auVar96._28_4_ = (uint)bVar64 * auVar81._28_4_ | (uint)!bVar64 * auVar91._28_4_;
          bVar64 = (bool)((byte)uVar56 & 1);
          auVar97._0_4_ = (float)((uint)bVar64 * auVar84._0_4_ | (uint)!bVar64 * auVar92._0_4_);
          bVar64 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar97._4_4_ = (float)((uint)bVar64 * auVar84._4_4_ | (uint)!bVar64 * auVar92._4_4_);
          bVar64 = (bool)((byte)(uVar56 >> 2) & 1);
          auVar97._8_4_ = (float)((uint)bVar64 * auVar84._8_4_ | (uint)!bVar64 * auVar92._8_4_);
          bVar64 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar97._12_4_ = (float)((uint)bVar64 * auVar84._12_4_ | (uint)!bVar64 * auVar92._12_4_);
          bVar64 = (bool)((byte)(uVar56 >> 4) & 1);
          auVar97._16_4_ = (float)((uint)bVar64 * auVar84._16_4_ | (uint)!bVar64 * auVar92._16_4_);
          bVar64 = (bool)((byte)(uVar56 >> 5) & 1);
          auVar97._20_4_ = (float)((uint)bVar64 * auVar84._20_4_ | (uint)!bVar64 * auVar92._20_4_);
          bVar64 = (bool)((byte)(uVar56 >> 6) & 1);
          auVar97._24_4_ = (float)((uint)bVar64 * auVar84._24_4_ | (uint)!bVar64 * auVar92._24_4_);
          bVar64 = SUB81(uVar56 >> 7,0);
          auVar97._28_4_ = (uint)bVar64 * auVar84._28_4_ | (uint)!bVar64 * auVar92._28_4_;
          bVar64 = (bool)((byte)uVar57 & 1);
          fVar65 = (float)((uint)bVar64 * auVar79._0_4_ | (uint)!bVar64 * auVar85._0_4_);
          bVar64 = (bool)((byte)(uVar57 >> 1) & 1);
          fVar100 = (float)((uint)bVar64 * auVar79._4_4_ | (uint)!bVar64 * auVar85._4_4_);
          bVar64 = (bool)((byte)(uVar57 >> 2) & 1);
          fVar101 = (float)((uint)bVar64 * auVar79._8_4_ | (uint)!bVar64 * auVar85._8_4_);
          bVar64 = (bool)((byte)(uVar57 >> 3) & 1);
          fVar102 = (float)((uint)bVar64 * auVar79._12_4_ | (uint)!bVar64 * auVar85._12_4_);
          bVar64 = (bool)((byte)(uVar57 >> 4) & 1);
          fVar103 = (float)((uint)bVar64 * auVar79._16_4_ | (uint)!bVar64 * auVar85._16_4_);
          bVar64 = (bool)((byte)(uVar57 >> 5) & 1);
          fVar104 = (float)((uint)bVar64 * auVar79._20_4_ | (uint)!bVar64 * auVar85._20_4_);
          bVar64 = (bool)((byte)(uVar57 >> 6) & 1);
          fVar105 = (float)((uint)bVar64 * auVar79._24_4_ | (uint)!bVar64 * auVar85._24_4_);
          bVar64 = SUB81(uVar57 >> 7,0);
          auVar43._4_4_ = fVar112 * fVar100;
          auVar43._0_4_ = fVar112 * fVar65;
          auVar43._8_4_ = fVar112 * fVar101;
          auVar43._12_4_ = fVar112 * fVar102;
          auVar43._16_4_ = fVar112 * fVar103;
          auVar43._20_4_ = fVar112 * fVar104;
          auVar43._24_4_ = fVar112 * fVar105;
          auVar43._28_4_ = fVar112;
          auVar66 = vfmadd213ps_fma(auVar129,auVar97,auVar43);
          auVar66 = vfmadd213ps_fma(auVar122,auVar96,ZEXT1632(auVar66));
          auVar77 = ZEXT1632(CONCAT412(auVar66._12_4_ + auVar66._12_4_,
                                       CONCAT48(auVar66._8_4_ + auVar66._8_4_,
                                                CONCAT44(auVar66._4_4_ + auVar66._4_4_,
                                                         auVar66._0_4_ + auVar66._0_4_))));
          auVar130._0_4_ = auVar73._0_4_ * fVar65;
          auVar130._4_4_ = auVar73._4_4_ * fVar100;
          auVar130._8_4_ = auVar73._8_4_ * fVar101;
          auVar130._12_4_ = auVar73._12_4_ * fVar102;
          auVar130._16_4_ = auVar73._16_4_ * fVar103;
          auVar130._20_4_ = auVar73._20_4_ * fVar104;
          auVar130._24_4_ = auVar73._24_4_ * fVar105;
          auVar130._28_4_ = 0;
          auVar66 = vfmadd213ps_fma(auVar74,auVar97,auVar130);
          auVar71 = vfmadd213ps_fma(auVar72,auVar96,ZEXT1632(auVar66));
          auVar72 = vrcp14ps_avx512vl(auVar77);
          auVar31._8_4_ = 0x80000000;
          auVar31._0_8_ = 0x8000000080000000;
          auVar31._12_4_ = 0x80000000;
          auVar31._16_4_ = 0x80000000;
          auVar31._20_4_ = 0x80000000;
          auVar31._24_4_ = 0x80000000;
          auVar31._28_4_ = 0x80000000;
          auVar78 = vxorps_avx512vl(auVar77,auVar31);
          auVar32._8_4_ = 0x3f800000;
          auVar32._0_8_ = 0x3f8000003f800000;
          auVar32._12_4_ = 0x3f800000;
          auVar32._16_4_ = 0x3f800000;
          auVar32._20_4_ = 0x3f800000;
          auVar32._24_4_ = 0x3f800000;
          auVar32._28_4_ = 0x3f800000;
          auVar73 = vfnmadd213ps_avx512vl(auVar72,auVar77,auVar32);
          auVar66 = vfmadd132ps_fma(auVar73,auVar72,auVar72);
          local_2580._28_4_ = auVar72._28_4_;
          local_2580._0_28_ =
               ZEXT1628(CONCAT412(auVar66._12_4_ * (auVar71._12_4_ + auVar71._12_4_),
                                  CONCAT48(auVar66._8_4_ * (auVar71._8_4_ + auVar71._8_4_),
                                           CONCAT44(auVar66._4_4_ * (auVar71._4_4_ + auVar71._4_4_),
                                                    auVar66._0_4_ * (auVar71._0_4_ + auVar71._0_4_))
                                          )));
          auVar120 = ZEXT3264(local_2580);
          auVar107._4_4_ = fVar113;
          auVar107._0_4_ = fVar113;
          auVar107._8_4_ = fVar113;
          auVar107._12_4_ = fVar113;
          auVar107._16_4_ = fVar113;
          auVar107._20_4_ = fVar113;
          auVar107._24_4_ = fVar113;
          auVar107._28_4_ = fVar113;
          uVar119 = vcmpps_avx512vl(local_2580,auVar107,2);
          uVar8 = *(undefined4 *)((long)&(local_27a8->super_RayK<1>).org.field_0 + 0xc);
          auVar33._4_4_ = uVar8;
          auVar33._0_4_ = uVar8;
          auVar33._8_4_ = uVar8;
          auVar33._12_4_ = uVar8;
          auVar33._16_4_ = uVar8;
          auVar33._20_4_ = uVar8;
          auVar33._24_4_ = uVar8;
          auVar33._28_4_ = uVar8;
          uVar30 = vcmpps_avx512vl(local_2580,auVar33,0xd);
          uVar29 = vcmpps_avx512vl(auVar77,auVar78,4);
          bVar52 = (byte)uVar119 & (byte)uVar30 & (byte)uVar29 & bVar52;
          if (bVar52 != 0) {
            uVar55 = vextractps_avx(SUB3216(*(undefined1 (*) [32])
                                             ((long)&(local_27a8->super_RayK<1>).org.field_0 + 0xc),
                                            0x10),2);
            local_25e0 = &local_27b1;
            local_25d8 = bVar52;
            auVar72 = vsubps_avx(local_2600,auVar94);
            auVar72 = vblendps_avx(auVar95,auVar72,0xf0);
            auVar78 = vsubps_avx(local_2600,auVar95);
            local_2620 = vblendps_avx(auVar94,auVar78,0xf0);
            local_2560[0] = auVar96._0_4_ * 1.0;
            local_2560[1] = auVar96._4_4_ * 1.0;
            local_2560[2] = auVar96._8_4_ * 1.0;
            local_2560[3] = auVar96._12_4_ * 1.0;
            fStack_2550 = auVar96._16_4_ * -1.0;
            fStack_254c = auVar96._20_4_ * -1.0;
            fStack_2548 = auVar96._24_4_ * -1.0;
            uStack_2544 = auVar96._28_4_;
            local_2540[0] = auVar97._0_4_ * 1.0;
            local_2540[1] = auVar97._4_4_ * 1.0;
            local_2540[2] = auVar97._8_4_ * 1.0;
            local_2540[3] = auVar97._12_4_ * 1.0;
            fStack_2530 = auVar97._16_4_ * -1.0;
            fStack_252c = auVar97._20_4_ * -1.0;
            fStack_2528 = auVar97._24_4_ * -1.0;
            uStack_2524 = auVar97._28_4_;
            local_2520[0] = fVar65 * 1.0;
            local_2520[1] = fVar100 * 1.0;
            local_2520[2] = fVar101 * 1.0;
            local_2520[3] = fVar102 * 1.0;
            fStack_2510 = fVar103 * -1.0;
            fStack_250c = fVar104 * -1.0;
            fStack_2508 = fVar105 * -1.0;
            uStack_2504 = (uint)bVar64 * auVar79._28_4_ | (uint)!bVar64 * auVar85._28_4_;
            auVar78 = vpbroadcastd_avx512vl();
            auVar78 = vpaddd_avx2(auVar78,_DAT_01fb7740);
            auVar66 = vcvtsi2ss_avx512f(in_XMM27,*(ushort *)(lVar48 + 8 + lVar51) - 1);
            auVar116._4_12_ = ZEXT812(0) << 0x20;
            auVar116._0_4_ = auVar66._0_4_;
            auVar71 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar116);
            auVar66 = vfnmadd213ss_fma(auVar71,auVar66,ZEXT416(0x40000000));
            fVar112 = auVar71._0_4_ * auVar66._0_4_;
            auVar78 = vcvtdq2ps_avx(auVar78);
            fVar113 = auVar78._28_4_ + auVar72._28_4_;
            fVar65 = (local_2600._0_4_ * auVar78._0_4_ + auVar72._0_4_) * fVar112;
            fVar100 = (local_2600._4_4_ * auVar78._4_4_ + auVar72._4_4_) * fVar112;
            local_2640._4_4_ = fVar100;
            local_2640._0_4_ = fVar65;
            fVar101 = (local_2600._8_4_ * auVar78._8_4_ + auVar72._8_4_) * fVar112;
            local_2640._8_4_ = fVar101;
            fVar102 = (local_2600._12_4_ * auVar78._12_4_ + auVar72._12_4_) * fVar112;
            local_2640._12_4_ = fVar102;
            fVar103 = (local_2600._16_4_ * auVar78._16_4_ + auVar72._16_4_) * fVar112;
            local_2640._16_4_ = fVar103;
            fVar104 = (local_2600._20_4_ * auVar78._20_4_ + auVar72._20_4_) * fVar112;
            local_2640._20_4_ = fVar104;
            fVar112 = (local_2600._24_4_ * auVar78._24_4_ + auVar72._24_4_) * fVar112;
            local_2640._24_4_ = fVar112;
            local_2640._28_4_ = fVar113;
            pGVar17 = (context->scene->geometries).items[local_2798].ptr;
            if ((pGVar17->mask & uVar55) != 0) {
              auVar72 = vpbroadcastd_avx512vl();
              auVar72 = vpaddd_avx2(auVar72,_DAT_01fb7760);
              auVar72 = vcvtdq2ps_avx(auVar72);
              auVar114._0_4_ = (float)(int)(*(ushort *)(lVar48 + 10 + lVar51) - 1);
              auVar114._4_12_ = auVar95._4_12_;
              auVar46._12_4_ = 0;
              auVar46._0_12_ = ZEXT812(0);
              auVar71 = vrcp14ss_avx512f(auVar46 << 0x20,ZEXT416((uint)auVar114._0_4_));
              auVar66 = vfnmadd213ss_fma(auVar71,auVar114,ZEXT416(0x40000000));
              fVar27 = auVar71._0_4_ * auVar66._0_4_;
              auVar34._8_4_ = 0x219392ef;
              auVar34._0_8_ = 0x219392ef219392ef;
              auVar34._12_4_ = 0x219392ef;
              auVar34._16_4_ = 0x219392ef;
              auVar34._20_4_ = 0x219392ef;
              auVar34._24_4_ = 0x219392ef;
              auVar34._28_4_ = 0x219392ef;
              uVar54 = vcmpps_avx512vl(local_2600,auVar34,5);
              auVar78 = vrcp14ps_avx512vl(local_2600);
              auVar118._8_4_ = 0x3f800000;
              auVar118._0_8_ = 0x3f8000003f800000;
              auVar118._12_4_ = 0x3f800000;
              auVar118._16_4_ = 0x3f800000;
              auVar118._20_4_ = 0x3f800000;
              auVar118._24_4_ = 0x3f800000;
              auVar118._28_4_ = 0x3f800000;
              auVar66 = vfnmadd213ps_fma(local_2600,auVar78,auVar118);
              auVar78 = vfmadd132ps_avx512vl(ZEXT1632(auVar66),auVar78,auVar78);
              fVar1 = (float)((uint)((byte)uVar54 & 1) * auVar78._0_4_);
              fVar2 = (float)((uint)((byte)(uVar54 >> 1) & 1) * auVar78._4_4_);
              fVar3 = (float)((uint)((byte)(uVar54 >> 2) & 1) * auVar78._8_4_);
              fVar4 = (float)((uint)((byte)(uVar54 >> 3) & 1) * auVar78._12_4_);
              fVar5 = (float)((uint)((byte)(uVar54 >> 4) & 1) * auVar78._16_4_);
              fVar6 = (float)((uint)((byte)(uVar54 >> 5) & 1) * auVar78._20_4_);
              fVar105 = (float)((uint)((byte)(uVar54 >> 6) & 1) * auVar78._24_4_);
              auVar44._4_4_ = fVar100 * fVar2;
              auVar44._0_4_ = fVar65 * fVar1;
              auVar44._8_4_ = fVar101 * fVar3;
              auVar44._12_4_ = fVar102 * fVar4;
              auVar44._16_4_ = fVar103 * fVar5;
              auVar44._20_4_ = fVar104 * fVar6;
              auVar44._24_4_ = fVar112 * fVar105;
              auVar44._28_4_ = fVar113;
              local_25c0 = vminps_avx(auVar44,auVar118);
              auVar45._4_4_ = (local_2600._4_4_ * auVar72._4_4_ + local_2620._4_4_) * fVar27 * fVar2
              ;
              auVar45._0_4_ = (local_2600._0_4_ * auVar72._0_4_ + local_2620._0_4_) * fVar27 * fVar1
              ;
              auVar45._8_4_ = (local_2600._8_4_ * auVar72._8_4_ + local_2620._8_4_) * fVar27 * fVar3
              ;
              auVar45._12_4_ =
                   (local_2600._12_4_ * auVar72._12_4_ + local_2620._12_4_) * fVar27 * fVar4;
              auVar45._16_4_ =
                   (local_2600._16_4_ * auVar72._16_4_ + local_2620._16_4_) * fVar27 * fVar5;
              auVar45._20_4_ =
                   (local_2600._20_4_ * auVar72._20_4_ + local_2620._20_4_) * fVar27 * fVar6;
              auVar45._24_4_ =
                   (local_2600._24_4_ * auVar72._24_4_ + local_2620._24_4_) * fVar27 * fVar105;
              auVar45._28_4_ = auVar72._28_4_ + local_2620._28_4_;
              local_25a0 = vminps_avx(auVar45,auVar118);
              auVar108._8_4_ = 0x7f800000;
              auVar108._0_8_ = 0x7f8000007f800000;
              auVar108._12_4_ = 0x7f800000;
              auVar108._16_4_ = 0x7f800000;
              auVar108._20_4_ = 0x7f800000;
              auVar108._24_4_ = 0x7f800000;
              auVar108._28_4_ = 0x7f800000;
              auVar72 = vblendmps_avx512vl(auVar108,local_2580);
              auVar98._0_4_ =
                   (uint)(bVar52 & 1) * auVar72._0_4_ | (uint)!(bool)(bVar52 & 1) * 0x7f800000;
              bVar64 = (bool)(bVar52 >> 1 & 1);
              auVar98._4_4_ = (uint)bVar64 * auVar72._4_4_ | (uint)!bVar64 * 0x7f800000;
              bVar64 = (bool)(bVar52 >> 2 & 1);
              auVar98._8_4_ = (uint)bVar64 * auVar72._8_4_ | (uint)!bVar64 * 0x7f800000;
              bVar64 = (bool)(bVar52 >> 3 & 1);
              auVar98._12_4_ = (uint)bVar64 * auVar72._12_4_ | (uint)!bVar64 * 0x7f800000;
              bVar64 = (bool)(bVar52 >> 4 & 1);
              auVar98._16_4_ = (uint)bVar64 * auVar72._16_4_ | (uint)!bVar64 * 0x7f800000;
              bVar64 = (bool)(bVar52 >> 5 & 1);
              auVar98._20_4_ = (uint)bVar64 * auVar72._20_4_ | (uint)!bVar64 * 0x7f800000;
              bVar64 = (bool)(bVar52 >> 6 & 1);
              auVar98._24_4_ = (uint)bVar64 * auVar72._24_4_ | (uint)!bVar64 * 0x7f800000;
              auVar98._28_4_ =
                   (uint)(bVar52 >> 7) * auVar72._28_4_ | (uint)!(bool)(bVar52 >> 7) * 0x7f800000;
              auVar72 = vshufps_avx(auVar98,auVar98,0xb1);
              auVar72 = vminps_avx(auVar98,auVar72);
              auVar78 = vshufpd_avx(auVar72,auVar72,5);
              auVar72 = vminps_avx(auVar72,auVar78);
              auVar78 = vpermpd_avx2(auVar72,0x4e);
              auVar72 = vminps_avx(auVar72,auVar78);
              uVar119 = vcmpps_avx512vl(auVar98,auVar72,0);
              bVar49 = bVar52;
              if ((bVar52 & (byte)uVar119) != 0) {
                bVar49 = bVar52 & (byte)uVar119;
              }
              uVar55 = 0;
              for (uVar53 = (uint)bVar49; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x80000000) {
                uVar55 = uVar55 + 1;
              }
              uVar54 = (ulong)uVar55;
              local_27b0 = local_27a0->args;
              if ((local_27b0->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar17->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                pRVar20 = local_27a0->user;
                local_26a0 = ZEXT432((uint)(local_27a8->super_RayK<1>).tfar);
                local_2660 = local_2580;
                do {
                  local_26c4 = *(undefined4 *)(local_25c0 + uVar54 * 4);
                  local_26c0 = *(undefined4 *)(local_25a0 + uVar54 * 4);
                  (ray->super_RayK<1>).tfar = local_2560[uVar54 - 8];
                  local_26d0 = local_2560[uVar54];
                  local_26cc = local_2540[uVar54];
                  local_26c8 = local_2520[uVar54];
                  local_26bc = (int)local_2788;
                  local_26b8 = (int)local_2798;
                  local_26b4 = pRVar20->instID[0];
                  local_26b0 = pRVar20->instPrimID[0];
                  local_278c = -1;
                  local_2700.valid = &local_278c;
                  local_2700.geometryUserPtr = pGVar17->userPtr;
                  local_2700.context = pRVar20;
                  local_2700.ray = (RTCRayN *)ray;
                  local_2700.hit = (RTCHitN *)&local_26d0;
                  local_2700.N = 1;
                  if (pGVar17->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01c86631:
                    if ((local_27b0->filter != (RTCFilterFunctionN)0x0) &&
                       (((local_27b0->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar17->field_8).field_0x2 & 0x40) != 0)))) {
                      (*local_27b0->filter)(&local_2700);
                      auVar120 = ZEXT3264(local_2660);
                      ray = local_27a8;
                      if (*local_2700.valid == 0) goto LAB_01c866d3;
                    }
                    (((Vec3f *)((long)local_2700.ray + 0x30))->field_0).field_0.x =
                         *(float *)local_2700.hit;
                    (((Vec3f *)((long)local_2700.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_2700.hit + 4);
                    (((Vec3f *)((long)local_2700.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_2700.hit + 8);
                    *(float *)((long)local_2700.ray + 0x3c) = *(float *)(local_2700.hit + 0xc);
                    *(float *)((long)local_2700.ray + 0x40) = *(float *)(local_2700.hit + 0x10);
                    *(float *)((long)local_2700.ray + 0x44) = *(float *)(local_2700.hit + 0x14);
                    *(float *)((long)local_2700.ray + 0x48) = *(float *)(local_2700.hit + 0x18);
                    *(float *)((long)local_2700.ray + 0x4c) = *(float *)(local_2700.hit + 0x1c);
                    *(float *)((long)local_2700.ray + 0x50) = *(float *)(local_2700.hit + 0x20);
                  }
                  else {
                    (*pGVar17->intersectionFilterN)(&local_2700);
                    auVar120 = ZEXT3264(local_2660);
                    ray = local_27a8;
                    if (*local_2700.valid != 0) goto LAB_01c86631;
LAB_01c866d3:
                    (local_27a8->super_RayK<1>).tfar = (float)local_26a0._0_4_;
                    ray = local_27a8;
                  }
                  bVar52 = ~(byte)(1 << ((uint)uVar54 & 0x1f)) & bVar52;
                  fVar112 = (ray->super_RayK<1>).tfar;
                  auVar35._4_4_ = fVar112;
                  auVar35._0_4_ = fVar112;
                  auVar35._8_4_ = fVar112;
                  auVar35._12_4_ = fVar112;
                  auVar35._16_4_ = fVar112;
                  auVar35._20_4_ = fVar112;
                  auVar35._24_4_ = fVar112;
                  auVar35._28_4_ = fVar112;
                  uVar119 = vcmpps_avx512vl(auVar120._0_32_,auVar35,2);
                  if ((bVar52 & (byte)uVar119) == 0) goto LAB_01c86486;
                  local_26a0 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                  bVar52 = bVar52 & (byte)uVar119;
                  auVar109._8_4_ = 0x7f800000;
                  auVar109._0_8_ = 0x7f8000007f800000;
                  auVar109._12_4_ = 0x7f800000;
                  auVar109._16_4_ = 0x7f800000;
                  auVar109._20_4_ = 0x7f800000;
                  auVar109._24_4_ = 0x7f800000;
                  auVar109._28_4_ = 0x7f800000;
                  auVar72 = vblendmps_avx512vl(auVar109,auVar120._0_32_);
                  auVar99._0_4_ =
                       (uint)(bVar52 & 1) * auVar72._0_4_ | (uint)!(bool)(bVar52 & 1) * 0x7f800000;
                  bVar64 = (bool)(bVar52 >> 1 & 1);
                  auVar99._4_4_ = (uint)bVar64 * auVar72._4_4_ | (uint)!bVar64 * 0x7f800000;
                  bVar64 = (bool)(bVar52 >> 2 & 1);
                  auVar99._8_4_ = (uint)bVar64 * auVar72._8_4_ | (uint)!bVar64 * 0x7f800000;
                  bVar64 = (bool)(bVar52 >> 3 & 1);
                  auVar99._12_4_ = (uint)bVar64 * auVar72._12_4_ | (uint)!bVar64 * 0x7f800000;
                  bVar64 = (bool)(bVar52 >> 4 & 1);
                  auVar99._16_4_ = (uint)bVar64 * auVar72._16_4_ | (uint)!bVar64 * 0x7f800000;
                  bVar64 = (bool)(bVar52 >> 5 & 1);
                  auVar99._20_4_ = (uint)bVar64 * auVar72._20_4_ | (uint)!bVar64 * 0x7f800000;
                  bVar64 = (bool)(bVar52 >> 6 & 1);
                  auVar99._24_4_ = (uint)bVar64 * auVar72._24_4_ | (uint)!bVar64 * 0x7f800000;
                  auVar99._28_4_ =
                       (uint)(bVar52 >> 7) * auVar72._28_4_ |
                       (uint)!(bool)(bVar52 >> 7) * 0x7f800000;
                  auVar72 = vshufps_avx(auVar99,auVar99,0xb1);
                  auVar72 = vminps_avx(auVar99,auVar72);
                  auVar78 = vshufpd_avx(auVar72,auVar72,5);
                  auVar72 = vminps_avx(auVar72,auVar78);
                  auVar78 = vpermpd_avx2(auVar72,0x4e);
                  auVar72 = vminps_avx(auVar72,auVar78);
                  uVar119 = vcmpps_avx512vl(auVar99,auVar72,0);
                  bVar47 = (byte)uVar119 & bVar52;
                  bVar49 = bVar52;
                  if (bVar47 != 0) {
                    bVar49 = bVar47;
                  }
                  uVar16 = 0;
                  for (uVar50 = (uint)bVar49; (uVar50 & 1) == 0; uVar50 = uVar50 >> 1 | 0x80000000)
                  {
                    uVar16 = uVar16 + 1;
                  }
                  uVar54 = (ulong)uVar16;
                } while( true );
              }
              fVar112 = *(float *)(local_25c0 + uVar54 * 4);
              fVar65 = *(float *)(local_25a0 + uVar54 * 4);
              fVar100 = local_2560[uVar54];
              fVar101 = local_2540[uVar54];
              fVar102 = local_2520[uVar54];
              (local_27a8->super_RayK<1>).tfar = local_2560[uVar54 - 8];
              (local_27a8->Ng).field_0.field_0.x = fVar100;
              (local_27a8->Ng).field_0.field_0.y = fVar101;
              (local_27a8->Ng).field_0.field_0.z = fVar102;
              local_27a8->u = fVar112;
              local_27a8->v = fVar65;
              local_27a8->primID = uVar50;
              local_27a8->geomID = uVar16;
              pRVar20 = local_27a0->user;
              local_27a8->instID[0] = pRVar20->instID[0];
              local_27a8->instPrimID[0] = pRVar20->instPrimID[0];
            }
          }
        }
LAB_01c86486:
        auVar131 = ZEXT3264(local_2400);
        auVar132 = ZEXT3264(local_2420);
        auVar139 = ZEXT3264(local_2460);
        auVar140 = ZEXT3264(local_2480);
        auVar141 = ZEXT3264(local_24a0);
        auVar142 = ZEXT3264(local_23e0);
        context = local_27a0;
        uVar54 = local_2718;
        uVar56 = local_2720;
        uVar57 = local_2728;
        uVar58 = local_2730;
        uVar59 = local_2738;
        uVar62 = local_2740;
        fVar104 = local_2440;
        fVar112 = fStack_243c;
        fVar65 = fStack_2438;
        fVar100 = fStack_2434;
        fVar101 = fStack_2430;
        fVar102 = fStack_242c;
        fVar103 = fStack_2428;
      }
    }
    auVar123 = ZEXT3264(local_24c0);
    auVar124 = ZEXT3264(local_24e0);
    auVar121 = ZEXT3264(local_2500);
    auVar120 = ZEXT3264(local_2680);
  }
  auVar72 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).tfar));
  auVar142 = ZEXT3264(auVar72);
  auVar72 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar134 = ZEXT3264(auVar72);
  auVar128 = ZEXT3264(CONCAT428(0xfffffff8,
                                CONCAT424(0xfffffff8,
                                          CONCAT420(0xfffffff8,
                                                    CONCAT416(0xfffffff8,
                                                              CONCAT412(0xfffffff8,
                                                                        CONCAT48(0xfffffff8,
                                                                                 0xfffffff8fffffff8)
                                                                       ))))));
  goto LAB_01c857cb;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }